

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

sysbvm_tuple_t sysbvm_tuple_printString(sysbvm_context_t *context,sysbvm_tuple_t tuple)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t printStringFunction;
  sysbvm_tuple_t type;
  sysbvm_tuple_t tuple_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_tuple_getType(context,tuple);
  sVar1 = sysbvm_type_getPrintStringFunction(context,sVar1);
  if (sVar1 == 0) {
    context_local = (sysbvm_context_t *)sysbvm_tuple_defaultPrintString(context,tuple);
  }
  else {
    context_local = (sysbvm_context_t *)sysbvm_function_apply1(context,sVar1,tuple);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_tuple_printString(sysbvm_context_t *context, sysbvm_tuple_t tuple)
{
    sysbvm_tuple_t type = sysbvm_tuple_getType(context, tuple);
    sysbvm_tuple_t printStringFunction = sysbvm_type_getPrintStringFunction(context, type);
    if(printStringFunction == SYSBVM_NULL_TUPLE)
        return sysbvm_tuple_defaultPrintString(context, tuple);
    return sysbvm_function_apply1(context, printStringFunction, tuple);
}